

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_skies.cpp
# Opt level: O2

void __thiscall ASkyPicker::PostBeginPlay(ASkyPicker *this)

{
  int iVar1;
  sector_t *psVar2;
  uint uVar3;
  ASkyViewpoint *actor;
  uint uVar4;
  TActorIterator<ASkyViewpoint> iterator;
  TActorIterator<ASkyViewpoint> local_18;
  
  AActor::PostBeginPlay(&this->super_AActor);
  iVar1 = (this->super_AActor).args[0];
  if (iVar1 == 0) {
LAB_004ae1a2:
    actor = (ASkyViewpoint *)0x0;
  }
  else {
    local_18.super_FActorIterator.base = (AActor *)0x0;
    local_18.super_FActorIterator.id = iVar1;
    actor = TActorIterator<ASkyViewpoint>::Next(&local_18);
    if (actor == (ASkyViewpoint *)0x0) {
      uVar4 = (this->super_AActor).args[0];
      if (uVar4 != 0) {
        Printf("Can\'t find SkyViewpoint %d for sector %td\n",(ulong)uVar4,
               ((long)(this->super_AActor).Sector - (long)sectors) / 0x218);
        goto LAB_004ae20d;
      }
      goto LAB_004ae1a2;
    }
  }
  uVar3 = P_GetSkyboxPortal(actor);
  uVar4 = (this->super_AActor).args[1];
  if (((uVar4 & 2) == 0) &&
     (psVar2 = (this->super_AActor).Sector, sectorPortals.Array[psVar2->Portals[1]].mType == 0)) {
    psVar2->Portals[1] = uVar3;
    uVar4 = (this->super_AActor).args[1];
  }
  if (((uVar4 & 1) == 0) &&
     (psVar2 = (this->super_AActor).Sector, sectorPortals.Array[psVar2->Portals[0]].mType == 0)) {
    psVar2->Portals[0] = uVar3;
  }
LAB_004ae20d:
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void ASkyPicker::PostBeginPlay ()
{
	ASkyViewpoint *box;
	Super::PostBeginPlay ();

	if (args[0] == 0)
	{
		box = NULL;
	}
	else
	{
		TActorIterator<ASkyViewpoint> iterator (args[0]);
		box = iterator.Next ();
	}

	if (box == NULL && args[0] != 0)
	{
		Printf ("Can't find SkyViewpoint %d for sector %td\n", args[0], Sector - sectors);
	}
	else
	{
		int boxindex = P_GetSkyboxPortal(box);
		// Do not override special portal types, only regular skies.
		if (0 == (args[1] & 2))
		{
			if (Sector->GetPortalType(sector_t::ceiling) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::ceiling] = boxindex;
		}
		if (0 == (args[1] & 1))
		{
			if (Sector->GetPortalType(sector_t::floor) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::floor] = boxindex;
		}
	}
	Destroy ();
}